

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_bfbs.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  uint __line;
  bool bVar1;
  uint8_t *puVar2;
  char *pcVar3;
  int iVar4;
  string jsongen2;
  string bfbs_file;
  string json_file;
  char *include_directories [4];
  string schema_file;
  string jsongen1;
  Parser parser2;
  Parser parser1;
  
  schema_file._M_dataplus._M_p = (pointer)&schema_file.field_2;
  schema_file._M_string_length = 0;
  json_file._M_dataplus._M_p = (pointer)&json_file.field_2;
  json_file._M_string_length = 0;
  schema_file.field_2._M_local_buf[0] = '\0';
  json_file.field_2._M_local_buf[0] = '\0';
  bfbs_file._M_dataplus._M_p = (pointer)&bfbs_file.field_2;
  bfbs_file._M_string_length = 0;
  bfbs_file.field_2._M_local_buf[0] = '\0';
  bVar1 = flatbuffers::LoadFile("tests/monster_test.fbs",false,&schema_file);
  if (bVar1) {
    bVar1 = flatbuffers::LoadFile("tests/monsterdata_test.golden",false,&json_file);
    if (bVar1) {
      iVar4 = 1;
      bVar1 = flatbuffers::LoadFile("tests/monster_test.bfbs",true,&bfbs_file);
      if (bVar1) {
        include_directories[2] = "tests/include_test";
        include_directories[3] = (char *)0x0;
        include_directories[0] = "samples";
        include_directories[1] = "tests";
        flatbuffers::IDLOptions::IDLOptions((IDLOptions *)&parser2);
        flatbuffers::Parser::Parser(&parser1,(IDLOptions *)&parser2);
        flatbuffers::IDLOptions::~IDLOptions((IDLOptions *)&parser2);
        bVar1 = flatbuffers::Parser::Parse
                          (&parser1,schema_file._M_dataplus._M_p,include_directories,(char *)0x0);
        if (!bVar1) {
          __line = 0x2d;
LAB_0013f0c6:
          __assert_fail("ok",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/samples/sample_bfbs.cpp"
                        ,__line,"int main(int, const char **)");
        }
        flatbuffers::IDLOptions::IDLOptions((IDLOptions *)&jsongen1);
        flatbuffers::Parser::Parser(&parser2,(IDLOptions *)&jsongen1);
        flatbuffers::IDLOptions::~IDLOptions((IDLOptions *)&jsongen1);
        bVar1 = flatbuffers::Parser::Deserialize
                          (&parser2,(uint8_t *)bfbs_file._M_dataplus._M_p,bfbs_file._M_string_length
                          );
        if (!bVar1) {
          __line = 0x33;
          goto LAB_0013f0c6;
        }
        bVar1 = flatbuffers::Parser::Parse
                          (&parser1,json_file._M_dataplus._M_p,include_directories,(char *)0x0);
        if (!bVar1) {
          __line = 0x37;
          goto LAB_0013f0c6;
        }
        bVar1 = flatbuffers::Parser::Parse
                          (&parser2,json_file._M_dataplus._M_p,include_directories,(char *)0x0);
        if (!bVar1) {
          __line = 0x39;
          goto LAB_0013f0c6;
        }
        jsongen1._M_dataplus._M_p = (pointer)&jsongen1.field_2;
        jsongen1._M_string_length = 0;
        jsongen1.field_2._M_local_buf[0] = '\0';
        puVar2 = flatbuffers::FlatBufferBuilderImpl<false>::GetBufferPointer(&parser1.builder_);
        pcVar3 = flatbuffers::GenText(&parser1,puVar2,&jsongen1);
        if (pcVar3 == (char *)0x0) {
          jsongen2._M_dataplus._M_p = (pointer)&jsongen2.field_2;
          jsongen2._M_string_length = 0;
          jsongen2.field_2._M_local_buf[0] = '\0';
          puVar2 = flatbuffers::FlatBufferBuilderImpl<false>::GetBufferPointer(&parser2.builder_);
          pcVar3 = flatbuffers::GenText(&parser2,puVar2,&jsongen2);
          if (pcVar3 == (char *)0x0) {
            bVar1 = std::operator!=(&jsongen1,&jsongen2);
            iVar4 = 0;
            pcVar3 = "The FlatBuffer has been parsed from JSON successfully.";
            if (bVar1) {
              iVar4 = 0;
              printf("%s----------------\n%s",jsongen1._M_dataplus._M_p,jsongen2._M_dataplus._M_p);
            }
          }
          else {
            iVar4 = 1;
            pcVar3 = "Couldn\'t serialize parsed data to JSON!";
          }
          puts(pcVar3);
          std::__cxx11::string::~string((string *)&jsongen2);
        }
        else {
          puts("Couldn\'t serialize parsed data to JSON!");
        }
        std::__cxx11::string::~string((string *)&jsongen1);
        flatbuffers::Parser::~Parser(&parser2);
        flatbuffers::Parser::~Parser(&parser1);
        goto LAB_0013ef7f;
      }
    }
  }
  puts("couldn\'t load files!");
  iVar4 = 1;
LAB_0013ef7f:
  std::__cxx11::string::~string((string *)&bfbs_file);
  std::__cxx11::string::~string((string *)&json_file);
  std::__cxx11::string::~string((string *)&schema_file);
  return iVar4;
}

Assistant:

int main(int /*argc*/, const char * /*argv*/[]) {
  // load FlatBuffer schema (.fbs) and JSON from disk
  std::string schema_file;
  std::string json_file;
  std::string bfbs_file;
  bool ok =
      flatbuffers::LoadFile("tests/monster_test.fbs", false, &schema_file) &&
      flatbuffers::LoadFile("tests/monsterdata_test.golden", false,
                            &json_file) &&
      flatbuffers::LoadFile("tests/monster_test.bfbs", true, &bfbs_file);
  if (!ok) {
    printf("couldn't load files!\n");
    return 1;
  }

  const char *include_directories[] = { "samples", "tests",
                                        "tests/include_test", nullptr };
  // parse fbs schema
  flatbuffers::Parser parser1;
  ok = parser1.Parse(schema_file.c_str(), include_directories);
  assert(ok);

  // inizialize parser by deserializing bfbs schema
  flatbuffers::Parser parser2;
  ok = parser2.Deserialize(reinterpret_cast<const uint8_t *>(bfbs_file.c_str()),
                           bfbs_file.length());
  assert(ok);

  // parse json in parser from fbs and bfbs
  ok = parser1.Parse(json_file.c_str(), include_directories);
  assert(ok);
  ok = parser2.Parse(json_file.c_str(), include_directories);
  assert(ok);

  // to ensure it is correct, we now generate text back from the binary,
  // and compare the two:
  std::string jsongen1;
  if (GenText(parser1, parser1.builder_.GetBufferPointer(), &jsongen1)) {
    printf("Couldn't serialize parsed data to JSON!\n");
    return 1;
  }

  std::string jsongen2;
  if (GenText(parser2, parser2.builder_.GetBufferPointer(), &jsongen2)) {
    printf("Couldn't serialize parsed data to JSON!\n");
    return 1;
  }

  if (jsongen1 != jsongen2) {
    printf("%s----------------\n%s", jsongen1.c_str(), jsongen2.c_str());
  }

  printf("The FlatBuffer has been parsed from JSON successfully.\n");
}